

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::LSTMWeightParams::MergePartialFromCodedStream
          (LSTMWeightParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint32 uVar7;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  WeightParams *pWVar8;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong extraout_RAX_08;
  ulong extraout_RAX_09;
  ulong extraout_RAX_10;
  ulong extraout_RAX_11;
  ulong extraout_RAX_12;
  ulong extraout_RAX_13;
  char cVar9;
  ulong uVar10;
  int local_ac;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_002246ff;
        uVar10 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_002246ff:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    uVar7 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_002241dc_default;
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (0x27 < uVar6) {
      if (uVar6 < 0x3c) {
        switch(uVar6) {
        case 0x28:
          if (cVar9 == 'B') {
            if (this->inputgatebiasvector_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->inputgatebiasvector_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar10 = extraout_RAX_00;
            goto LAB_002246ee;
          }
          break;
        case 0x29:
          if (cVar9 == 'J') {
            if (this->forgetgatebiasvector_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->forgetgatebiasvector_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar10 = extraout_RAX_09;
            goto LAB_002246ee;
          }
          break;
        case 0x2a:
          if (cVar9 == 'R') {
            if (this->blockinputbiasvector_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->blockinputbiasvector_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar10 = extraout_RAX_04;
            goto LAB_002246ee;
          }
          break;
        case 0x2b:
          if (cVar9 == 'Z') {
            if (this->outputgatebiasvector_ == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)operator_new(0x50);
              WeightParams::WeightParams(pWVar8);
              this->outputgatebiasvector_ = pWVar8;
            }
            MergePartialFromCodedStream();
            uVar10 = extraout_RAX_07;
            goto LAB_002246ee;
          }
        }
      }
      else if (uVar6 == 0x3c) {
        if (cVar9 == -0x1e) {
          if (this->inputgatepeepholevector_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->inputgatepeepholevector_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar10 = extraout_RAX_13;
          goto LAB_002246ee;
        }
      }
      else if (uVar6 == 0x3d) {
        if (cVar9 == -0x16) {
          if (this->forgetgatepeepholevector_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->forgetgatepeepholevector_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar10 = extraout_RAX_10;
          goto LAB_002246ee;
        }
      }
      else if ((uVar6 == 0x3e) && (cVar9 == -0xe)) {
        if (this->outputgatepeepholevector_ == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar8);
          this->outputgatepeepholevector_ = pWVar8;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_02;
        goto LAB_002246ee;
      }
      goto switchD_002241dc_default;
    }
    switch(uVar6) {
    case 1:
      if (cVar9 != '\n') break;
      if (this->inputgateweightmatrix_ == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(pWVar8);
        this->inputgateweightmatrix_ = pWVar8;
      }
      MergePartialFromCodedStream();
      uVar10 = extraout_RAX_01;
LAB_002246ee:
      iVar5 = local_ac;
      if ((uVar10 & 1) == 0) goto LAB_002241a1;
      goto LAB_002241a3;
    case 2:
      if (cVar9 == '\x12') {
        if (this->forgetgateweightmatrix_ == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar8);
          this->forgetgateweightmatrix_ = pWVar8;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_12;
        goto LAB_002246ee;
      }
      break;
    case 3:
      if (cVar9 == '\x1a') {
        if (this->blockinputweightmatrix_ == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar8);
          this->blockinputweightmatrix_ = pWVar8;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_06;
        goto LAB_002246ee;
      }
      break;
    case 4:
      if (cVar9 == '\"') {
        if (this->outputgateweightmatrix_ == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(pWVar8);
          this->outputgateweightmatrix_ = pWVar8;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_11;
        goto LAB_002246ee;
      }
      break;
    default:
      switch(uVar6) {
      case 0x14:
        if (cVar9 == -0x5e) {
          if (this->inputgaterecursionmatrix_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->inputgaterecursionmatrix_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar10 = extraout_RAX;
          goto LAB_002246ee;
        }
        break;
      case 0x15:
        if (cVar9 == -0x56) {
          if (this->forgetgaterecursionmatrix_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->forgetgaterecursionmatrix_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar10 = extraout_RAX_08;
          goto LAB_002246ee;
        }
        break;
      case 0x16:
        if (cVar9 == -0x4e) {
          if (this->blockinputrecursionmatrix_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->blockinputrecursionmatrix_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar10 = extraout_RAX_03;
          goto LAB_002246ee;
        }
        break;
      case 0x17:
        if (cVar9 == -0x46) {
          if (this->outputgaterecursionmatrix_ == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(pWVar8);
            this->outputgaterecursionmatrix_ = pWVar8;
          }
          MergePartialFromCodedStream();
          uVar10 = extraout_RAX_05;
          goto LAB_002246ee;
        }
      }
    }
switchD_002241dc_default:
    iVar5 = 7;
    if ((uVar7 & 7) != 4 && uVar7 != 0) {
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
      if (bVar4) {
LAB_002241a1:
        iVar5 = 0;
      }
      else {
        iVar5 = 6;
      }
    }
LAB_002241a3:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool LSTMWeightParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LSTMWeightParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.WeightParams inputGateWeightMatrix = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGateWeightMatrix = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams blockInputWeightMatrix = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_blockinputweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateWeightMatrix = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgateweightmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams inputGateRecursionMatrix = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGateRecursionMatrix = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams blockInputRecursionMatrix = 22;
      case 22: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(178u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_blockinputrecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 23;
      case 23: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(186u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgaterecursionmatrix()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams inputGateBiasVector = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGateBiasVector = 41;
      case 41: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(330u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams blockInputBiasVector = 42;
      case 42: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(338u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_blockinputbiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGateBiasVector = 43;
      case 43: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(346u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgatebiasvector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams inputGatePeepholeVector = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(482u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inputgatepeepholevector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams forgetGatePeepholeVector = 61;
      case 61: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(490u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_forgetgatepeepholevector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams outputGatePeepholeVector = 62;
      case 62: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(498u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_outputgatepeepholevector()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LSTMWeightParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LSTMWeightParams)
  return false;
#undef DO_
}